

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCGeometryCollider.cpp
# Opt level: O2

int chrono::collision::ChGeometryCollider::ComputeSphereBoxCollisions
              (ChSphere *mgeo1,Vector *c1,ChBox *mgeo2,ChMatrix33<double> *R2,Vector *T2,
              ChNarrowPhaseCollider *mcollider,bool just_intersection,bool swap_pairs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  bool bVar24;
  int i;
  int ipoint;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  double dVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  double dVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  double dVar51;
  undefined1 auVar52 [16];
  double dVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 local_168 [16];
  double local_158;
  Vector relC;
  ChCollisionPair temp;
  Vector pt_2;
  undefined1 local_78 [16];
  double local_68;
  ChVector<float> local_58;
  ChVector<double> v_2;
  
  ChTransform<double>::TransformParentToLocal(c1,T2,R2);
  if (just_intersection) {
    auVar28._8_8_ = 0;
    auVar28._0_8_ = relC.m_data[0];
    dVar27 = (mgeo2->Size).m_data[0];
    auVar5._8_8_ = 0x7fffffffffffffff;
    auVar5._0_8_ = 0x7fffffffffffffff;
    auVar25 = vandpd_avx512vl(auVar28,auVar5);
    dVar1 = mgeo1->rad;
    dVar30 = auVar25._0_8_;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = relC.m_data[1];
    if (dVar30 <= dVar27 + dVar1) {
      auVar9._8_8_ = 0x7fffffffffffffff;
      auVar9._0_8_ = 0x7fffffffffffffff;
      auVar25 = vandpd_avx512vl(auVar38,auVar9);
      dVar31 = auVar25._0_8_;
      dVar51 = (mgeo2->Size).m_data[1];
      if ((dVar31 <= dVar51) &&
         (auVar43._8_8_ = 0, auVar43._0_8_ = relC.m_data[2], auVar10._8_8_ = 0x7fffffffffffffff,
         auVar10._0_8_ = 0x7fffffffffffffff, auVar25 = vandpd_avx512vl(auVar43,auVar10),
         auVar25._0_8_ <= (mgeo2->Size).m_data[2])) goto LAB_00d80d4c;
    }
    else {
      dVar51 = (mgeo2->Size).m_data[1];
      auVar6._8_8_ = 0x7fffffffffffffff;
      auVar6._0_8_ = 0x7fffffffffffffff;
      auVar25 = vandpd_avx512vl(auVar38,auVar6);
      dVar31 = auVar25._0_8_;
    }
    auVar44._8_8_ = 0;
    auVar44._0_8_ = relC.m_data[2];
    if ((dVar27 < dVar30) || (dVar1 + dVar51 < dVar31)) {
      dVar48 = (mgeo2->Size).m_data[2];
      auVar8._8_8_ = 0x7fffffffffffffff;
      auVar8._0_8_ = 0x7fffffffffffffff;
      auVar25 = vandpd_avx512vl(auVar44,auVar8);
      dVar42 = auVar25._0_8_;
    }
    else {
      auVar7._8_8_ = 0x7fffffffffffffff;
      auVar7._0_8_ = 0x7fffffffffffffff;
      auVar25 = vandpd_avx512vl(auVar44,auVar7);
      dVar48 = (mgeo2->Size).m_data[2];
      dVar42 = auVar25._0_8_;
      if (dVar42 <= dVar48) goto LAB_00d80d4c;
    }
    if (((dVar1 + dVar48 < dVar42) || (dVar51 < dVar31)) || (dVar27 < dVar30)) {
      dVar53 = (dVar30 - dVar27) * (dVar30 - dVar27);
      auVar40._8_8_ = 0;
      auVar40._0_8_ = dVar53 + (dVar31 - dVar51) * (dVar31 - dVar51);
      auVar25 = vsqrtsd_avx(auVar40,auVar40);
      if ((dVar1 < auVar25._0_8_) || (dVar48 < dVar42)) {
        dVar51 = (mgeo2->Size).m_data[1];
        dVar48 = (dVar42 - dVar48) * (dVar42 - dVar48);
        dVar42 = dVar31 - dVar51;
        dVar42 = dVar42 * dVar42;
        auVar49._8_8_ = 0;
        auVar49._0_8_ = dVar42 + dVar48;
        auVar25 = vsqrtsd_avx(auVar49,auVar49);
        if (((dVar1 < auVar25._0_8_) || (dVar27 < dVar30)) &&
           (((auVar33._8_8_ = 0, auVar33._0_8_ = dVar48 + dVar53,
             auVar25 = vsqrtsd_avx(auVar33,auVar33), dVar1 < auVar25._0_8_ || (dVar51 < dVar31)) &&
            (auVar34._8_8_ = 0, auVar34._0_8_ = dVar53 + dVar42 + dVar48,
            auVar25 = vsqrtsd_avx(auVar34,auVar34), dVar1 < auVar25._0_8_)))) {
          return 0;
        }
      }
    }
LAB_00d80d4c:
    ChCollisionPair::ChCollisionPair(&temp,&mgeo1->super_ChGeometry,(ChGeometry *)mgeo2);
    ChNarrowPhaseCollider::AddCollisionPair(mcollider,&temp);
    return 1;
  }
  local_158 = 0.0;
  auVar21._8_8_ = relC.m_data[1];
  auVar21._0_8_ = relC.m_data[0];
  local_168 = ZEXT816(0);
  auVar25._8_8_ = 0x7fffffffffffffff;
  auVar25._0_8_ = 0x7fffffffffffffff;
  auVar26 = vandpd_avx512vl(auVar21,auVar25);
  dVar27 = (mgeo2->Size).m_data[0];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar27;
  dVar1 = mgeo1->rad;
  auVar25 = vshufpd_avx(auVar21,auVar21,1);
  dVar51 = auVar26._0_8_;
  dVar30 = auVar25._0_8_;
  if (dVar51 <= dVar27 + dVar1) {
    auVar26._8_8_ = 0x7fffffffffffffff;
    auVar26._0_8_ = 0x7fffffffffffffff;
    auVar25 = vandpd_avx512vl(auVar25,auVar26);
    dVar48 = auVar25._0_8_;
    dVar31 = (mgeo2->Size).m_data[1];
    auVar32._8_8_ = 0;
    auVar32._0_8_ = dVar31;
    if ((dVar31 < dVar48) ||
       (auVar45._8_8_ = 0, auVar45._0_8_ = relC.m_data[2], auVar20._8_8_ = 0x7fffffffffffffff,
       auVar20._0_8_ = 0x7fffffffffffffff, auVar25 = vandpd_avx512vl(auVar45,auVar20),
       (mgeo2->Size).m_data[2] < auVar25._0_8_)) goto LAB_00d80c3b;
    local_158 = relC.m_data[2];
    local_168._8_8_ = dVar30;
    if (relC.m_data[0] < 0.0) {
LAB_00d80e79:
      auVar17._8_8_ = 0x8000000000000000;
      auVar17._0_8_ = 0x8000000000000000;
      auVar25 = vxorpd_avx512vl(auVar29,auVar17);
      local_168._0_8_ = vmovlpd_avx(auVar25);
    }
    else {
LAB_00d80ec3:
      local_168._0_8_ = dVar27;
    }
  }
  else {
    auVar32._8_8_ = 0;
    auVar32._0_8_ = (mgeo2->Size).m_data[1];
    auVar11._8_8_ = 0x7fffffffffffffff;
    auVar11._0_8_ = 0x7fffffffffffffff;
    auVar25 = vandpd_avx512vl(auVar25,auVar11);
    dVar48 = auVar25._0_8_;
LAB_00d80c3b:
    auVar52._8_8_ = 0;
    auVar52._0_8_ = relC.m_data[2];
    dVar31 = auVar32._0_8_;
    if (dVar48 <= dVar1 + dVar31) {
      auVar19._8_8_ = 0x7fffffffffffffff;
      auVar19._0_8_ = 0x7fffffffffffffff;
      auVar25 = vandpd_avx512vl(auVar52,auVar19);
      dVar53 = auVar25._0_8_;
      dVar42 = (mgeo2->Size).m_data[2];
      auVar46._8_8_ = 0;
      auVar46._0_8_ = dVar42;
      if ((dVar27 < dVar51) || (dVar42 < dVar53)) goto LAB_00d80c5f;
      local_168._0_8_ = relC.m_data[0];
      if (0.0 <= dVar30) goto LAB_00d80e0c;
LAB_00d80dad:
      local_158 = relC.m_data[2];
      auVar14._8_8_ = 0x8000000000000000;
      auVar14._0_8_ = 0x8000000000000000;
      auVar25 = vxorpd_avx512vl(auVar32,auVar14);
      local_168._8_8_ = vmovlpd_avx(auVar25);
    }
    else {
      auVar46._8_8_ = 0;
      auVar46._0_8_ = (mgeo2->Size).m_data[2];
      auVar12._8_8_ = 0x7fffffffffffffff;
      auVar12._0_8_ = 0x7fffffffffffffff;
      auVar25 = vandpd_avx512vl(auVar52,auVar12);
      dVar53 = auVar25._0_8_;
LAB_00d80c5f:
      dVar42 = auVar46._0_8_;
      if (((dVar1 + dVar42 < dVar53) || (dVar31 < dVar48)) || (dVar27 < dVar51)) {
        dVar2 = (dVar51 - dVar27) * (dVar51 - dVar27);
        dVar3 = (dVar48 - dVar31) * (dVar48 - dVar31);
        auVar55._8_8_ = 0;
        auVar55._0_8_ = dVar2 + dVar3;
        auVar25 = vsqrtsd_avx(auVar55,auVar55);
        if ((dVar1 < auVar25._0_8_) || (dVar42 < dVar53)) {
          dVar53 = (dVar53 - dVar42) * (dVar53 - dVar42);
          auVar54._8_8_ = 0;
          auVar54._0_8_ = dVar3 + dVar53;
          auVar25 = vsqrtsd_avx(auVar54,auVar54);
          if ((dVar1 < auVar25._0_8_) || (dVar27 < dVar51)) {
            bVar24 = false;
            auVar39._8_8_ = 0;
            auVar39._0_8_ = dVar53 + dVar2;
            auVar25 = vsqrtsd_avx(auVar39,auVar39);
            if ((dVar1 < auVar25._0_8_) || (dVar31 < dVar48)) goto LAB_00d80ecc;
            local_168._8_8_ = vmovhpd_avx(auVar21);
            local_158 = dVar42;
            if (relC.m_data[2] <= 0.0) {
              auVar18._8_8_ = 0x8000000000000000;
              auVar18._0_8_ = 0x8000000000000000;
              auVar25 = vxorpd_avx512vl(auVar46,auVar18);
              local_158 = (double)vmovlpd_avx(auVar25);
            }
            if (relC.m_data[0] <= 0.0) goto LAB_00d80e79;
            goto LAB_00d80ec3;
          }
          if (dVar30 <= 0.0) {
            auVar16._8_8_ = 0x8000000000000000;
            auVar16._0_8_ = 0x8000000000000000;
            auVar25 = vxorpd_avx512vl(auVar32,auVar16);
            dVar31 = (double)vmovlpd_avx(auVar25);
          }
          local_168._8_8_ = dVar31;
          local_168._0_8_ = relC.m_data[0];
          local_158 = dVar42;
          if (relC.m_data[2] <= 0.0) goto LAB_00d80c96;
        }
        else {
          local_168._0_8_ = dVar27;
          if (relC.m_data[0] <= 0.0) {
            auVar15._8_8_ = 0x8000000000000000;
            auVar15._0_8_ = 0x8000000000000000;
            auVar25 = vxorpd_avx512vl(auVar29,auVar15);
            local_168._0_8_ = vmovlpd_avx(auVar25);
          }
          if (dVar30 <= 0.0) goto LAB_00d80dad;
LAB_00d80e0c:
          local_158 = relC.m_data[2];
          local_168._8_8_ = dVar31;
        }
      }
      else {
        local_168 = auVar21;
        local_158 = dVar42;
        if (relC.m_data[2] < 0.0) {
LAB_00d80c96:
          auVar13._8_8_ = 0x8000000000000000;
          auVar13._0_8_ = 0x8000000000000000;
          auVar25 = vxorpd_avx512vl(auVar46,auVar13);
          local_158 = (double)vmovlpd_avx(auVar25);
        }
      }
    }
  }
  bVar24 = true;
LAB_00d80ecc:
  for (ipoint = 1; ipoint != 9; ipoint = ipoint + 1) {
    if (bVar24) goto LAB_00d80f79;
    geometry::ChBox::GetPn(&pt_2,mgeo2,ipoint);
    auVar22._8_8_ = relC.m_data[1];
    auVar22._0_8_ = relC.m_data[0];
    temp._0_16_ = vsubpd_avx((undefined1  [16])pt_2.m_data._0_16_,auVar22);
    temp.p1.m_data[0] = pt_2.m_data[2] - relC.m_data[2];
    dVar27 = ChVector<double>::Length((ChVector<double> *)&temp);
    if (dVar27 <= mgeo1->rad) {
      geometry::ChBox::GetPn((ChVector<double> *)&temp,mgeo2,ipoint);
      bVar24 = true;
      local_168._0_8_ = temp.geo1;
      local_168._8_8_ = temp.geo2;
      local_158 = temp.p1.m_data[0];
    }
  }
  if (bVar24) {
LAB_00d80f79:
    ChTransform<double>::TransformLocalToParent((ChVector<double> *)local_168,T2,R2);
    temp._0_16_ = vsubpd_avx((undefined1  [16])pt_2.m_data._0_16_,*(undefined1 (*) [16])c1->m_data);
    temp.p1.m_data[0] = pt_2.m_data[2] - c1->m_data[2];
    Vnorm<double>((ChVector<double> *)local_78,(ChVector<double> *)&temp);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = local_68;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = T2->m_data[0] - c1->m_data[0];
    auVar50._8_8_ = 0;
    auVar50._0_8_ = (T2->m_data[1] - c1->m_data[1]) * (double)local_78._8_8_;
    auVar25 = vfmadd231sd_fma(auVar50,local_78,auVar47);
    auVar41._8_8_ = 0;
    auVar41._0_8_ = T2->m_data[2] - c1->m_data[2];
    auVar25 = vfmadd231sd_fma(auVar25,auVar36,auVar41);
    dVar27 = local_68;
    if (auVar25._0_8_ < 0.0) {
      local_78._0_8_ = local_78._0_8_ ^ 0x8000000000000000;
      local_78._8_8_ = -(double)local_78._8_8_;
      auVar37._0_8_ = -local_68;
      auVar37._8_8_ = 0x8000000000000000;
      local_68 = (double)vmovlpd_avx(auVar37);
      dVar27 = auVar37._0_8_;
    }
    dVar1 = mgeo1->rad;
    v_2.m_data[0] = c1->m_data[0] + dVar1 * local_78._0_8_;
    v_2.m_data[1] = c1->m_data[1] + dVar1 * local_78._8_8_;
    v_2.m_data[2] = c1->m_data[2] + dVar1 * dVar27;
    auVar25 = vcvtpd2ps_avx(local_78);
    local_58.m_data._0_8_ = vmovlps_avx(auVar25);
    local_58.m_data[2] = (float)dVar27;
    ChCollisionPair::ChCollisionPair
              (&temp,&mgeo1->super_ChGeometry,(ChGeometry *)mgeo2,&v_2,&pt_2,&local_58,(float *)0x0)
    ;
    dVar27 = temp.p1.m_data[2];
    if (swap_pairs) {
      temp._0_16_ = vpermilps_avx((undefined1  [16])temp._0_16_,0x4e);
      auVar23._8_8_ = temp.p2.m_data[2];
      auVar23._0_8_ = temp.p2.m_data[1];
      auVar23._16_4_ = temp.normal.m_data[0];
      auVar23._20_4_ = temp.normal.m_data[1];
      auVar23._24_4_ = temp.normal.m_data[2];
      auVar23._28_4_ = temp._76_4_;
      auVar4._8_8_ = temp.p1.m_data[1];
      auVar4._0_8_ = temp.p1.m_data[0];
      auVar4._16_8_ = temp.p1.m_data[2];
      auVar4._24_8_ = temp.p2.m_data[0];
      auVar4 = vperm2f128_avx(auVar23,auVar4,0x20);
      temp.p1.m_data[0] = temp.p2.m_data[0];
      temp.p1.m_data[1] = auVar4._0_8_;
      temp.p1.m_data[2] = auVar4._8_8_;
      temp.p2.m_data[0] = auVar4._16_8_;
      temp.p2.m_data[1] = auVar4._24_8_;
      temp.p2.m_data[2] = dVar27;
      temp.normal.m_data[2] = -temp.normal.m_data[2];
      auVar35._0_8_ = temp.normal.m_data._0_8_ ^ 0x8000000080000000;
      auVar35._8_4_ = 0x80000000;
      auVar35._12_4_ = 0x80000000;
      temp.normal.m_data._0_8_ = vmovlps_avx(auVar35);
    }
    ChNarrowPhaseCollider::AddCollisionPair(mcollider,&temp);
  }
  return 0;
}

Assistant:

int ChGeometryCollider::ComputeSphereBoxCollisions(
    geometry::ChSphere& mgeo1,         ///< sphere
    Vector* c1,                        ///< absolute position of center
    geometry::ChBox& mgeo2,            ///< box
    ChMatrix33<>* R2,                  ///< absolute rotation of 2nd model (with box)
    Vector* T2,                        ///< absolute position of 2nd model (with box)
    ChNarrowPhaseCollider& mcollider,  ///< reference to a collider to store contacts into
    bool just_intersection,  ///< if true, just report if intersecting (no further calculus on normal, depht, etc.)
    bool swap_pairs          ///< if true, pairs are reported as Triangle-Sphere (triangle will be the main ref.)
) {
    Vector relC = ChTransform<>::TransformParentToLocal(*c1, *T2, *R2);

    if (just_intersection) {
        if (((fabs(relC.x()) <= mgeo2.Size.x() + mgeo1.rad) && (fabs(relC.y()) <= mgeo2.Size.y()) &&
             (fabs(relC.z()) <= mgeo2.Size.z())) ||
            ((fabs(relC.y()) <= mgeo2.Size.y() + mgeo1.rad) && (fabs(relC.x()) <= mgeo2.Size.x()) &&
             (fabs(relC.z()) <= mgeo2.Size.z())) ||
            ((fabs(relC.z()) <= mgeo2.Size.z() + mgeo1.rad) && (fabs(relC.x()) <= mgeo2.Size.x()) &&
             (fabs(relC.y()) <= mgeo2.Size.y())) ||
            ((sqrt(pow(fabs(relC.x()) - mgeo2.Size.x(), 2) + pow(fabs(relC.y()) - mgeo2.Size.y(), 2)) <= mgeo1.rad) &&
             (fabs(relC.z()) <= mgeo2.Size.z())) ||
            ((sqrt(pow(fabs(relC.y()) - mgeo2.Size.y(), 2) + pow(fabs(relC.z()) - mgeo2.Size.z(), 2)) <= mgeo1.rad) &&
             (fabs(relC.x()) <= mgeo2.Size.x())) ||
            ((sqrt(pow(fabs(relC.z()) - mgeo2.Size.z(), 2) + pow(fabs(relC.x()) - mgeo2.Size.x(), 2)) <= mgeo1.rad) &&
             (fabs(relC.y()) <= mgeo2.Size.y())) ||
            ((sqrt(pow(fabs(relC.x()) - mgeo2.Size.x(), 2) + pow(fabs(relC.y()) - mgeo2.Size.y(), 2) +
                   pow(fabs(relC.z()) - mgeo2.Size.z(), 2)) <= mgeo1.rad))) {
            ChCollisionPair temp = ChCollisionPair(&mgeo1, &mgeo2);

            mcollider.AddCollisionPair(&temp);
            return 1;
        }
    } else {
        Vector pt_loc;
        bool done = false;

        if ((fabs(relC.x()) <= mgeo2.Size.x() + mgeo1.rad) && (fabs(relC.y()) <= mgeo2.Size.y()) &&
            (fabs(relC.z()) <= mgeo2.Size.z())) {
            if (relC.x() >= 0) {
                pt_loc = relC;
                pt_loc.x() = mgeo2.Size.x();
                done = true;
            } else {
                pt_loc = relC;
                pt_loc.x() = -mgeo2.Size.x();
                done = true;
            }
        }
        if (!done) {
            if ((fabs(relC.y()) <= mgeo2.Size.y() + mgeo1.rad) && (fabs(relC.z()) <= mgeo2.Size.z()) &&
                (fabs(relC.x()) <= mgeo2.Size.x())) {
                if (relC.y() >= 0) {
                    pt_loc = relC;
                    pt_loc.y() = mgeo2.Size.y();
                    done = true;
                } else {
                    pt_loc = relC;
                    pt_loc.y() = -mgeo2.Size.y();
                    done = true;
                }
            }
        }
        if (!done) {
            if ((fabs(relC.z()) <= mgeo2.Size.z() + mgeo1.rad) && (fabs(relC.x()) <= mgeo2.Size.x()) &&
                (fabs(relC.y()) <= mgeo2.Size.y())) {
                if (relC.z() >= 0) {
                    pt_loc = relC;
                    pt_loc.z() = mgeo2.Size.z();
                    done = true;
                } else {
                    pt_loc = relC;
                    pt_loc.z() = -mgeo2.Size.z();
                    done = true;
                }
            }
        }
        if (!done) {
            if ((sqrt(pow(fabs(relC.x()) - mgeo2.Size.x(), 2) + pow(fabs(relC.y()) - mgeo2.Size.y(), 2)) <=
                 mgeo1.rad) &&
                (fabs(relC.z()) <= mgeo2.Size.z())) {
                if (relC.x() > 0) {
                    if (relC.y() > 0) {
                        pt_loc = relC;
                        pt_loc.x() = mgeo2.Size.x();
                        pt_loc.y() = mgeo2.Size.y();
                        done = true;
                    } else {
                        pt_loc = relC;
                        pt_loc.x() = mgeo2.Size.x();
                        pt_loc.y() = -mgeo2.Size.y();
                        done = true;
                    }
                } else if (relC.y() > 0) {
                    pt_loc = relC;
                    pt_loc.x() = -mgeo2.Size.x();
                    pt_loc.y() = mgeo2.Size.y();
                    done = true;
                } else {
                    pt_loc = relC;
                    pt_loc.x() = -mgeo2.Size.x();
                    pt_loc.y() = -mgeo2.Size.y();
                    done = true;
                }
            }
        }
        if (!done) {
            if ((sqrt(pow(fabs(relC.y()) - mgeo2.Size.y(), 2) + pow(fabs(relC.z()) - mgeo2.Size.z(), 2)) <=
                 mgeo1.rad) &&
                (fabs(relC.x()) <= mgeo2.Size.x())) {
                if (relC.y() > 0) {
                    if (relC.z() > 0) {
                        pt_loc = relC;
                        pt_loc.y() = mgeo2.Size.y();
                        pt_loc.z() = mgeo2.Size.z();
                        done = true;
                    } else {
                        pt_loc = relC;
                        pt_loc.y() = mgeo2.Size.y();
                        pt_loc.z() = -mgeo2.Size.z();
                        done = true;
                    }
                } else if (relC.z() > 0) {
                    pt_loc = relC;
                    pt_loc.y() = -mgeo2.Size.y();
                    pt_loc.z() = mgeo2.Size.z();
                    done = true;
                } else {
                    pt_loc = relC;
                    pt_loc.y() = -mgeo2.Size.y();
                    pt_loc.z() = -mgeo2.Size.z();
                    done = true;
                }
            }
        }
        if (!done) {
            if ((sqrt(pow(fabs(relC.z()) - mgeo2.Size.z(), 2) + pow(fabs(relC.x()) - mgeo2.Size.x(), 2)) <=
                 mgeo1.rad) &&
                (fabs(relC.y()) <= mgeo2.Size.y())) {
                if (relC.z() > 0) {
                    if (relC.x() > 0) {
                        pt_loc = relC;
                        pt_loc.z() = mgeo2.Size.z();
                        pt_loc.x() = mgeo2.Size.x();
                        done = true;
                    } else {
                        pt_loc = relC;
                        pt_loc.z() = mgeo2.Size.z();
                        pt_loc.x() = -mgeo2.Size.x();
                        done = true;
                    }
                } else if (relC.x() > 0) {
                    pt_loc = relC;
                    pt_loc.z() = -mgeo2.Size.z();
                    pt_loc.x() = mgeo2.Size.x();
                    done = true;
                } else {
                    pt_loc = relC;
                    pt_loc.z() = -mgeo2.Size.z();
                    pt_loc.x() = -mgeo2.Size.x();
                    done = true;
                }
            }
        }
        for (int i = 1; i <= 8; i++) {
            if (done)
                break;
            if (Vlength(mgeo2.GetPn(i) - relC) <= mgeo1.rad) {
                pt_loc = mgeo2.GetPn(i);
                done = true;
            }
        }

        if (done) {
            Vector pt_2 = ChTransform<>::TransformLocalToParent(pt_loc, *T2, *R2);
            Vector mnormal = Vnorm(pt_2 - *c1);
            if (Vdot(mnormal, *T2 - *c1) < 0)
                mnormal = -mnormal;
            Vector pt_1 = *c1 + (mnormal * mgeo1.rad);
            ChCollisionPair mcoll(&mgeo1, &mgeo2,  // geometries
                                  pt_1,            // p1
                                  pt_2,            // p2
                                  mnormal          // normal
            );
            if (swap_pairs)
                mcoll.SwapGeometries();
            mcollider.AddCollisionPair(&mcoll);
        }
    }

    return 0;
}